

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

void Gia_QbfLearnConstraint(Qbf_Man_t *p,Vec_Int_t *vValues)

{
  int iVar1;
  int local_2c;
  lit lStack_28;
  int Lits [2];
  int Entry;
  int status;
  int i;
  Vec_Int_t *vValues_local;
  Qbf_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vValues);
  if (iVar1 != p->nPars) {
    __assert_fail("Vec_IntSize(vValues) == p->nPars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x31d,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
  }
  printf("  Pattern   ");
  Vec_IntPrintBinary(vValues);
  printf("\n");
  for (Entry = 0; iVar1 = Vec_IntSize(vValues), Entry < iVar1; Entry = Entry + 1) {
    Lits[0] = Vec_IntEntry(vValues,Entry);
    local_2c = Abc_Var2Lit(Entry,Lits[0]);
    Lits[1] = sat_solver_solve(p->pSatSyn,&local_2c,&lStack_28,0,0,0,0);
    printf("  Var =%4d ",(ulong)(uint)Entry);
    if (Lits[1] == 1) {
      Gia_QbfOnePattern(p,p->vLits);
      Vec_IntPrintBinary(p->vLits);
      printf("\n");
    }
    else {
      printf("UNSAT\n");
      local_2c = Abc_LitNot(local_2c);
      Lits[1] = sat_solver_addclause(p->pSatSyn,&local_2c,&lStack_28);
      if (Lits[1] == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                      ,0x32b,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
      }
    }
  }
  iVar1 = Vec_IntSize(vValues);
  if (iVar1 == p->nPars) {
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == p->nPars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                ,0x332,"void Gia_QbfLearnConstraint(Qbf_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_QbfLearnConstraint( Qbf_Man_t * p, Vec_Int_t * vValues )
{
    int i, status, Entry, Lits[2];
    assert( Vec_IntSize(vValues) == p->nPars );
    printf( "  Pattern   " );
    Vec_IntPrintBinary( vValues );
    printf( "\n" );
    Vec_IntForEachEntry( vValues, Entry, i )
    {
        Lits[0] = Abc_Var2Lit( i, Entry );
        status = sat_solver_solve( p->pSatSyn, Lits, Lits+1, 0, 0, 0, 0 );
        printf( "  Var =%4d ", i );
        if ( status != l_True )
        {
            printf( "UNSAT\n" );
            Lits[0] = Abc_LitNot(Lits[0]);
            status = sat_solver_addclause( p->pSatSyn, Lits, Lits+1 );
            assert( status );
            continue;
        }
        Gia_QbfOnePattern( p, p->vLits );
        Vec_IntPrintBinary( p->vLits );
        printf( "\n" );
    }
    assert( Vec_IntSize(vValues) == p->nPars );
}